

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfparse.c
# Opt level: O0

int sf_parser_item(sf_parser *sfp,sf_value *dest)

{
  int iVar1;
  sf_parser *sfp_00;
  sf_parser *in_RSI;
  sf_parser *in_RDI;
  int rv;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int local_4;
  
  sfp_00 = (sf_parser *)(ulong)in_RDI->state;
  switch(sfp_00) {
  case (sf_parser *)0x0:
    parser_discard_sp((sf_parser *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    iVar1 = parser_eof(in_RDI);
    if (iVar1 != 0) {
      return -1;
    }
    if (*in_RDI->pos == '(') {
      if (in_RSI != (sf_parser *)0x0) {
        *(undefined4 *)&in_RSI->pos = 6;
        *(undefined4 *)((long)&in_RSI->pos + 4) = 0;
      }
      in_RDI->pos = in_RDI->pos + 1;
      in_RDI->state = 0x1c;
      return 0;
    }
    iVar1 = parser_bare_item(in_RSI,(sf_value *)
                                    CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    if (iVar1 != 0) {
      return iVar1;
    }
    in_RDI->state = 0x19;
    return 0;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/sfparse.c"
                  ,0x3e4,"int sf_parser_item(sf_parser *, sf_value *)");
  case (sf_parser *)0x19:
    goto switchD_001297e6_caseD_19;
  case (sf_parser *)0x1b:
    goto switchD_001297e6_caseD_1b;
  case (sf_parser *)0x1c:
    iVar1 = parser_skip_inner_list(sfp_00);
    if (iVar1 != 0) {
      return iVar1;
    }
switchD_001297e6_caseD_19:
    local_4 = parser_skip_params(sfp_00);
    if (local_4 == 0) {
      in_stack_ffffffffffffffe4 = 0;
switchD_001297e6_caseD_1b:
      parser_discard_sp((sf_parser *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      iVar1 = parser_eof(in_RDI);
      if (iVar1 == 0) {
        local_4 = -1;
      }
      else {
        local_4 = -2;
      }
    }
    return local_4;
  }
}

Assistant:

int sf_parser_item(sf_parser *sfp, sf_value *dest) {
  int rv;

  switch (sfp->state) {
  case SF_STATE_INITIAL:
    parser_discard_sp(sfp);

    if (parser_eof(sfp)) {
      return SF_ERR_PARSE_ERROR;
    }

    break;
  case SF_STATE_ITEM_INNER_LIST_BEFORE:
    rv = parser_skip_inner_list(sfp);
    if (rv != 0) {
      return rv;
    }

    /* fall through */
  case SF_STATE_ITEM_BEFORE_PARAMS:
    rv = parser_skip_params(sfp);
    if (rv != 0) {
      return rv;
    }

    /* fall through */
  case SF_STATE_ITEM_AFTER:
    parser_discard_sp(sfp);

    if (!parser_eof(sfp)) {
      return SF_ERR_PARSE_ERROR;
    }

    return SF_ERR_EOF;
  default:
    assert(0);
    abort();
  }

  if (*sfp->pos == '(') {
    if (dest) {
      dest->type = SF_TYPE_INNER_LIST;
      dest->flags = SF_VALUE_FLAG_NONE;
    }

    ++sfp->pos;

    sfp->state = SF_STATE_ITEM_INNER_LIST_BEFORE;

    return 0;
  }

  rv = parser_bare_item(sfp, dest);
  if (rv != 0) {
    return rv;
  }

  sfp->state = SF_STATE_ITEM_BEFORE_PARAMS;

  return 0;
}